

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O3

void __thiscall NJamSpell::TTokenizer::TTokenizer(TTokenizer *this)

{
  locale *plVar1;
  
  this->_vptr_TTokenizer = (_func_int **)&PTR_Dump_001239e8;
  (this->Alphabet)._M_h._M_buckets = &(this->Alphabet)._M_h._M_single_bucket;
  (this->Alphabet)._M_h._M_bucket_count = 1;
  (this->Alphabet)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->Alphabet)._M_h._M_element_count = 0;
  (this->Alphabet)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->Alphabet)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->Alphabet)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  plVar1 = (locale *)std::locale::classic();
  std::locale::locale(&this->Locale,plVar1);
  return;
}

Assistant:

TTokenizer::TTokenizer()
    : Locale(std::locale::classic())
{
}